

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_loggedin(Curl_easy *data)

{
  connectdata *conn_00;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if (((uint)conn_00->bits >> 0x14 & 1) == 0) {
    conn._4_4_ = ftp_state_pwd(data,conn_00);
  }
  else {
    conn._4_4_ = Curl_pp_sendf(data,&(conn_00->proto).ftpc.pp,"PBSZ %d",0);
    if (conn._4_4_ == CURLE_OK) {
      _ftp_state(data,'\x06');
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode ftp_state_loggedin(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(conn->bits.ftp_use_control_ssl) {
    /* PBSZ = PROTECTION BUFFER SIZE.

    The 'draft-murray-auth-ftp-ssl' (draft 12, page 7) says:

    Specifically, the PROT command MUST be preceded by a PBSZ
    command and a PBSZ command MUST be preceded by a successful
    security data exchange (the TLS negotiation in this case)

    ... (and on page 8):

    Thus the PBSZ command must still be issued, but must have a
    parameter of '0' to indicate that no buffering is taking place
    and the data connection should not be encapsulated.
    */
    result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "PBSZ %d", 0);
    if(!result)
      ftp_state(data, FTP_PBSZ);
  }
  else {
    result = ftp_state_pwd(data, conn);
  }
  return result;
}